

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_renderer.c
# Opt level: O0

void GPU_GetDefaultRendererOrder(int *order_size,GPU_RendererID *order)

{
  undefined1 local_178 [24];
  undefined1 local_160 [24];
  undefined1 local_148 [24];
  undefined1 local_130 [24];
  char *local_118;
  GPU_RendererID default_order [10];
  int count;
  GPU_RendererID *order_local;
  int *order_size_local;
  
  GPU_MakeRendererID((GPU_RendererID *)local_130,"OpenGL 4",5,4,0);
  local_118 = (char *)local_130._0_8_;
  default_order[0].name = (char *)local_130._8_8_;
  default_order[0].renderer = local_130._16_4_;
  default_order[0].major_version = local_130._20_4_;
  GPU_MakeRendererID((GPU_RendererID *)local_148,"OpenGL 3",4,3,0);
  default_order[0]._16_8_ = local_148._0_8_;
  default_order[1].name = (char *)local_148._8_8_;
  default_order[1].renderer = local_148._16_4_;
  default_order[1].major_version = local_148._20_4_;
  GPU_MakeRendererID((GPU_RendererID *)local_160,"OpenGL 2",3,2,0);
  default_order[1]._16_8_ = local_160._0_8_;
  default_order[2].name = (char *)local_160._8_8_;
  default_order[2].renderer = local_160._16_4_;
  default_order[2].major_version = local_160._20_4_;
  GPU_MakeRendererID((GPU_RendererID *)local_178,"OpenGL 1",2,1,1);
  default_order[2]._16_8_ = local_178._0_8_;
  default_order[3].name = (char *)local_178._8_8_;
  default_order[3].renderer = local_178._16_4_;
  default_order[3].major_version = local_178._20_4_;
  if (order_size != (int *)0x0) {
    *order_size = 4;
  }
  if (order != (GPU_RendererID *)0x0) {
    memcpy(order,&local_118,0x60);
  }
  return;
}

Assistant:

void GPU_GetDefaultRendererOrder(int* order_size, GPU_RendererID* order)
{
    int count = 0;
    GPU_RendererID default_order[GPU_RENDERER_ORDER_MAX];
    
    #ifndef SDL_GPU_DISABLE_GLES
        #ifndef SDL_GPU_DISABLE_GLES_3
            default_order[count++] = GPU_MakeRendererID("OpenGLES 3", GPU_RENDERER_GLES_3, 3, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_2
            default_order[count++] = GPU_MakeRendererID("OpenGLES 2", GPU_RENDERER_GLES_2, 2, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_GLES_1
            default_order[count++] = GPU_MakeRendererID("OpenGLES 1", GPU_RENDERER_GLES_1, 1, 1);
        #endif
    #endif
    
    #ifndef SDL_GPU_DISABLE_OPENGL
        #ifdef __MACOSX__
        
            // My understanding of OS X OpenGL support:
            // OS X 10.9: GL 2.1, 3.3, 4.1
            // OS X 10.7: GL 2.1, 3.2
            // OS X 10.6: GL 1.4, 2.1
            #ifndef SDL_GPU_DISABLE_OPENGL_4
            default_order[count++] = GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 1);
            #endif
            #ifndef SDL_GPU_DISABLE_OPENGL_3
            default_order[count++] = GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 2);
            #endif
        
        #else
        
            #ifndef SDL_GPU_DISABLE_OPENGL_4
            default_order[count++] = GPU_MakeRendererID("OpenGL 4", GPU_RENDERER_OPENGL_4, 4, 0);
            #endif
            #ifndef SDL_GPU_DISABLE_OPENGL_3
            default_order[count++] = GPU_MakeRendererID("OpenGL 3", GPU_RENDERER_OPENGL_3, 3, 0);
            #endif
            
        #endif
        
        #ifndef SDL_GPU_DISABLE_OPENGL_2
        default_order[count++] = GPU_MakeRendererID("OpenGL 2", GPU_RENDERER_OPENGL_2, 2, 0);
        #endif
        #ifndef SDL_GPU_DISABLE_OPENGL_1
        default_order[count++] = GPU_MakeRendererID("OpenGL 1", GPU_RENDERER_OPENGL_1, 1, 1);
        #endif
        
    #endif
    
    if(order_size != NULL)
        *order_size = count;
    
    if(order != NULL && count > 0)
        memcpy(order, default_order, count*sizeof(GPU_RendererID));
}